

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

string * booster::log::sinks::format_plain_text_message_tz_abi_cxx11_(message *msg,int tz_offset)

{
  level_type level;
  int iVar1;
  time_put *ptVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined1 extraout_DL;
  int in_EDX;
  message *in_RSI;
  string *in_RDI;
  ptime pVar5;
  int minutes;
  int hours;
  char sign;
  tm formatted;
  ptime now;
  ostringstream ss;
  ptime *in_stack_fffffffffffffc98;
  ptime *in_stack_fffffffffffffca0;
  message *in_stack_fffffffffffffca8;
  ostreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffcb0;
  message *in_stack_fffffffffffffcb8;
  char local_2fa;
  string local_298 [36];
  int local_274;
  int local_270;
  char local_269;
  undefined8 local_268;
  undefined1 local_260;
  undefined8 local_258;
  undefined4 local_250;
  locale local_248;
  undefined1 local_240 [56];
  longlong local_208;
  int local_200;
  longlong local_1f8;
  int local_1f0;
  longlong local_1e8;
  int local_1e0;
  longlong local_1d8;
  int local_1d0;
  longlong local_1c8;
  int local_1c0;
  longlong local_1b8;
  int local_1b0;
  locale local_198;
  long local_190 [47];
  int local_14;
  message *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::locale::classic();
  std::ios::imbue(&local_198);
  std::locale::~locale(&local_198);
  pVar5 = ptime::now();
  local_1d8 = pVar5.sec;
  local_1d0 = pVar5.nsec;
  local_1c8 = local_1d8;
  local_1c0 = local_1d0;
  pVar5 = ptime::from_number((double)in_stack_fffffffffffffcb0);
  local_1f8 = pVar5.sec;
  local_1f0 = pVar5.nsec;
  local_1e8 = local_1f8;
  local_1e0 = local_1f0;
  pVar5 = ptime::operator+(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  local_208 = pVar5.sec;
  local_200 = pVar5.nsec;
  local_1b8 = local_208;
  local_1b0 = local_200;
  ptime::universal_time(in_stack_fffffffffffffca0);
  std::ios_base::getloc((ios_base *)in_stack_fffffffffffffc98);
  ptVar2 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (&local_248);
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::ostreambuf_iterator
            (in_stack_fffffffffffffcb0,(ostream_type *)in_stack_fffffffffffffca8);
  local_268 = std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
                        (ptVar2,local_258,local_250,
                         (long)local_190 + *(long *)(local_190[0] + -0x18),0x20,local_240,
                         "%Y-%m-%d %H:%M:%S","");
  local_260 = extraout_DL;
  std::locale::~locale(&local_248);
  std::operator<<((ostream *)local_190," GMT");
  if (local_14 != 0) {
    local_2fa = '+';
    if (local_14 < 1) {
      local_2fa = '-';
    }
    local_269 = local_2fa;
    if (local_14 < 0) {
      local_14 = -local_14;
    }
    local_270 = local_14 / 0xe10;
    local_274 = (local_14 / 0x3c) % 0x3c;
    poVar3 = std::operator<<((ostream *)local_190,local_2fa);
    std::ostream::operator<<(poVar3,local_270);
    if (local_274 != 0) {
      poVar3 = std::operator<<((ostream *)local_190,':');
      std::ostream::operator<<(poVar3,local_274);
    }
  }
  std::operator<<((ostream *)local_190,";");
  pcVar4 = message::module(local_10);
  poVar3 = std::operator<<((ostream *)local_190,pcVar4);
  poVar3 = std::operator<<(poVar3,", ");
  level = message::level(local_10);
  pcVar4 = logger::level_to_string(level);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,": ");
  message::log_message_abi_cxx11_(in_stack_fffffffffffffca8);
  std::operator<<(poVar3,local_298);
  std::__cxx11::string::~string(local_298);
  poVar3 = std::operator<<((ostream *)local_190," (");
  pcVar4 = message::file_name(in_stack_fffffffffffffcb8);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,":");
  iVar1 = message::file_line(local_10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return in_RDI;
}

Assistant:

std::string format_plain_text_message_tz(message const &msg,int tz_offset)
		{
			std::ostringstream ss;
			ss.imbue(std::locale::classic());
			ptime now = ptime::now() + ptime::from_number(tz_offset);
			std::tm formatted = ptime::universal_time(now);
			static char const format[]="%Y-%m-%d %H:%M:%S";
			std::use_facet<std::time_put<char> >(ss.getloc()).put(ss,ss,' ',&formatted,format,format+sizeof(format)-1);
			ss << " GMT";
			if(tz_offset != 0) {
				char sign = tz_offset > 0 ? '+' : '-';
				if(tz_offset < 0)
					tz_offset = -tz_offset;
				int hours = tz_offset  / 3600;
				int minutes = tz_offset / 60 % 60;
				ss << sign << hours;
				if(minutes!=0)
					ss << ':' << minutes;
			}
			ss << ";";
			ss << msg.module()<<", " << logger::level_to_string(msg.level()) << ": " << msg.log_message();

			ss <<" (" << msg.file_name() <<":" <<msg.file_line() <<")";
			return ss.str();
		}